

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int add_sub_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B,int flip_B)

{
  short sVar1;
  int iVar2;
  int cmp;
  int s;
  int ret;
  int flip_B_local;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  sVar1 = A->s;
  if ((int)A->s * (int)B->s * flip_B < 0) {
    iVar2 = mbedtls_mpi_cmp_abs(A,B);
    if (iVar2 < 0) {
      cmp = mbedtls_mpi_sub_abs(X,B,A);
      if (cmp == 0) {
        X->s = -sVar1;
      }
    }
    else {
      cmp = mbedtls_mpi_sub_abs(X,A,B);
      if (cmp == 0) {
        if (iVar2 == 0) {
          sVar1 = 1;
        }
        X->s = sVar1;
      }
    }
  }
  else {
    cmp = mbedtls_mpi_add_abs(X,A,B);
    if (cmp == 0) {
      X->s = sVar1;
    }
  }
  return cmp;
}

Assistant:

static int add_sub_mpi(mbedtls_mpi *X,
                       const mbedtls_mpi *A, const mbedtls_mpi *B,
                       int flip_B)
{
    int ret, s;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(B != NULL);

    s = A->s;
    if (A->s * B->s * flip_B < 0) {
        int cmp = mbedtls_mpi_cmp_abs(A, B);
        if (cmp >= 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(X, A, B));
            /* If |A| = |B|, the result is 0 and we must set the sign bit
             * to +1 regardless of which of A or B was negative. Otherwise,
             * since |A| > |B|, the sign is the sign of A. */
            X->s = cmp == 0 ? 1 : s;
        } else {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(X, B, A));
            /* Since |A| < |B|, the sign is the opposite of A. */
            X->s = -s;
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_add_abs(X, A, B));
        X->s = s;
    }

cleanup:

    return ret;
}